

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O1

void __thiscall
google::protobuf::util::converter::JsonObjectWriter::WriteRawString
          (JsonObjectWriter *this,StringPiece s)

{
  CodedOutputStream *this_00;
  uint8 *puVar1;
  size_t __n;
  
  this_00 = this->stream_;
  puVar1 = this_00->cur_;
  __n = (size_t)(int)s.length_;
  if ((long)(this_00->impl_).end_ - (long)puVar1 < (long)__n) {
    puVar1 = io::EpsCopyOutputStream::WriteRawFallback(&this_00->impl_,s.ptr_,(int)s.length_,puVar1)
    ;
  }
  else {
    memcpy(puVar1,s.ptr_,__n);
    puVar1 = puVar1 + __n;
  }
  this_00->cur_ = puVar1;
  return;
}

Assistant:

void WriteRawString(StringPiece s) {
    stream_->WriteRaw(s.data(), s.length());
  }